

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O3

uint32_t helper_neon_qshl_u32_aarch64(CPUARMState_conflict *env,uint32_t arg1,uint32_t arg2)

{
  uint uVar1;
  byte bVar2;
  neon_u32 vsrc2;
  neon_u32 vsrc1;
  
  bVar2 = (byte)arg2;
  if ((char)bVar2 < ' ') {
    if ((char)bVar2 < -0x1f) {
      return 0;
    }
    if ((char)bVar2 < '\0') {
      return arg1 >> (-bVar2 & 0x1f);
    }
    uVar1 = arg1 << (bVar2 & 0x1f);
    if (uVar1 >> (bVar2 & 0x1f) == arg1) {
      return uVar1;
    }
  }
  else if (arg1 == 0) {
    return 0;
  }
  (env->vfp).qc[0] = 1;
  return 0xffffffff;
}

Assistant:

uint64_t HELPER(neon_qshl_u64)(CPUARMState *env, uint64_t val, uint64_t shiftop)
{
    int8_t shift = (int8_t)shiftop;
    if (shift >= 64) {
        if (val) {
            val = ~(uint64_t)0;
            SET_QC();
        }
    } else if (shift <= -64) {
        val = 0;
    } else if (shift < 0) {
        val >>= -shift;
    } else {
        uint64_t tmp = val;
        val <<= shift;
        if ((val >> shift) != tmp) {
            SET_QC();
            val = ~(uint64_t)0;
        }
    }
    return val;
}